

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O0

void __thiscall OpenMD::UniformField::UniformField(UniformField *this,SimInfo *info)

{
  Globals *pGVar1;
  SimInfo *in_RSI;
  ForceModifier *in_RDI;
  
  ForceModifier::ForceModifier(in_RDI,in_RSI);
  in_RDI->_vptr_ForceModifier = (_func_int **)&PTR__UniformField_0050ad98;
  *(undefined1 *)&in_RDI[1]._vptr_ForceModifier = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ForceModifier + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ForceModifier + 2) = 0;
  Vector3<double>::Vector3((Vector3<double> *)0x370c76);
  pGVar1 = SimInfo::getSimParams(in_RDI->info_);
  in_RDI[1].info_ = (SimInfo *)pGVar1;
  return;
}

Assistant:

UniformField::UniformField(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doUniformField {false},
      doParticlePot {false} {
    simParams = info_->getSimParams();
  }